

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O2

AccelerometerSensor * __thiscall
iDynTree::AccelerometerSensor::operator=(AccelerometerSensor *this,AccelerometerSensor *other)

{
  if (this != other) {
    AccelerometerPrivateAttributes::operator=(this->pimpl,other->pimpl);
  }
  return this;
}

Assistant:

AccelerometerSensor& AccelerometerSensor::operator=(const AccelerometerSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}